

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrBodyJointFB value)

{
  bool bVar1;
  allocator local_89;
  string vuid;
  string error_str;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_FB_body_tracking"), bVar1)) {
    if ((uint)(value + XR_BODY_JOINT_HIPS_FB) < 0x48) {
      return true;
    }
  }
  else {
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string((string *)&error_str,"XrBodyJointFB requires extension ",&local_89)
    ;
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&error_str);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)&error_str);
    std::__cxx11::string::~string((string *)&vuid);
  }
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrBodyJointFB value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_FB_body_tracking, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_FB_body_tracking")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrBodyJointFB requires extension ";
        error_str += " \"XR_FB_body_tracking\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_BODY_JOINT_ROOT_FB:
            return true;
        case XR_BODY_JOINT_HIPS_FB:
            return true;
        case XR_BODY_JOINT_SPINE_LOWER_FB:
            return true;
        case XR_BODY_JOINT_SPINE_MIDDLE_FB:
            return true;
        case XR_BODY_JOINT_SPINE_UPPER_FB:
            return true;
        case XR_BODY_JOINT_CHEST_FB:
            return true;
        case XR_BODY_JOINT_NECK_FB:
            return true;
        case XR_BODY_JOINT_HEAD_FB:
            return true;
        case XR_BODY_JOINT_LEFT_SHOULDER_FB:
            return true;
        case XR_BODY_JOINT_LEFT_SCAPULA_FB:
            return true;
        case XR_BODY_JOINT_LEFT_ARM_UPPER_FB:
            return true;
        case XR_BODY_JOINT_LEFT_ARM_LOWER_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_WRIST_TWIST_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_SHOULDER_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_SCAPULA_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_ARM_UPPER_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_ARM_LOWER_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_WRIST_TWIST_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_PALM_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_WRIST_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_THUMB_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_INDEX_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_MIDDLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_RING_TIP_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_LEFT_HAND_LITTLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_PALM_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_WRIST_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_THUMB_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_INDEX_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_MIDDLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_RING_TIP_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_METACARPAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_PROXIMAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_INTERMEDIATE_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_DISTAL_FB:
            return true;
        case XR_BODY_JOINT_RIGHT_HAND_LITTLE_TIP_FB:
            return true;
        case XR_BODY_JOINT_COUNT_FB:
            return true;
        case XR_BODY_JOINT_NONE_FB:
            return true;
    default:
        return false;
}
}